

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     sub<true,(InstructionSet::x86::AccessType)2,unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (access_t<unsigned_char,_(InstructionSet::x86::AccessType)2> destination,
               read_t<unsigned_char> source,Context *context)

{
  byte bVar1;
  byte value;
  
  bVar1 = *destination;
  value = (bVar1 - source) + -1 + ((context->flags).carry_ == 0);
  (context->flags).carry_ =
       ((~(uint)value | (uint)(bVar1 & ~source)) & (uint)(byte)(bVar1 | ~source)) >> 7 ^ 1;
  (context->flags).auxiliary_carry_ = (uint)((byte)(*destination ^ source ^ value) >> 4 & 1);
  (context->flags).overflow_ = (uint)((*destination ^ source) & (*destination ^ value) & 0x80);
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,value);
  *destination = value;
  return;
}

Assistant:

void sub(
	access_t<IntT, destination_type> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST - (SRC [+ CF]);
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination - source - (with_borrow ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<false, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<false, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	if constexpr (is_writeable(destination_type)) {
		destination = result;
	}
}